

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++:1031:13)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_test_c__:1031:13)>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> depResult;
  Maybe<capnproto_test::capnp::test::TestInterface::Server_&> local_360;
  NullableValue<kj::Exception> local_358;
  char local_1c0;
  Server *local_1b8;
  ExceptionOr<kj::_::Void> local_1b0;
  
  local_358.isSet = false;
  local_1c0 = '\0';
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)&local_358);
  if (local_358.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_1b0,&local_358.field_1.value);
    local_1b0.value.ptr.isSet = false;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1b0);
  }
  else {
    if (local_1c0 != '\x01') goto LAB_0017933c;
    local_360.ptr = local_1b8;
    local_1b8 = (Server *)0x0;
    anon_class_8_1_9ee849da_for_func::operator()(&this->func,&local_360);
    local_1b0.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1b0.value.ptr.isSet = true;
    ExceptionOr<kj::_::Void>::operator=((ExceptionOr<kj::_::Void> *)output,&local_1b0);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_1b0);
LAB_0017933c:
  NullableValue<kj::Exception>::~NullableValue(&local_358);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }